

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O0

int prov_custom_hsm_sign_with_identity
              (HSM_CLIENT_HANDLE handle,uchar *data,size_t data_len,uchar **key,size_t *key_len)

{
  uchar *puVar1;
  size_t signed_data_len;
  int result;
  size_t *key_len_local;
  uchar **key_local;
  size_t data_len_local;
  uchar *data_local;
  HSM_CLIENT_HANDLE handle_local;
  
  if ((((handle == (HSM_CLIENT_HANDLE)0x0) || (data == (uchar *)0x0)) || (key == (uchar **)0x0)) ||
     (key_len == (size_t *)0x0)) {
    printf("Invalid handle value specified");
    signed_data_len._4_4_ = 0xf2;
  }
  else {
    puVar1 = (uchar *)malloc(10);
    *key = puVar1;
    if (puVar1 == (uchar *)0x0) {
      printf("Failure allocating storage root key\r\n");
      signed_data_len._4_4_ = 0xff;
    }
    else {
      memcpy(*key,"Encrypted data\r\n",10);
      *key_len = 10;
      signed_data_len._4_4_ = 0;
    }
  }
  return signed_data_len._4_4_;
}

Assistant:

int prov_custom_hsm_sign_with_identity(HSM_CLIENT_HANDLE handle, const unsigned char* data, size_t data_len, unsigned char** key, size_t* key_len)
{
    int result;
    if (handle == NULL || data == NULL || key == NULL || key_len == NULL)
    {
        (void)printf("Invalid handle value specified");
        result = __LINE__;
    }
    else
    {
        (void)data;
        (void)data_len;

        // TODO: Need to implement signing the data variable and malloc the key and return it to the sdk

        size_t signed_data_len = 10;
        if ((*key = (unsigned char*)malloc(signed_data_len)) == NULL)
        {
            (void)printf("Failure allocating storage root key\r\n");
            result = __LINE__;
        }
        else
        {
            memcpy(*key, ENCRYPTED_DATA, signed_data_len);
            *key_len = signed_data_len;
            result = 0;
        }
    }
    return result;
}